

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledSetSuperPropertyStrict<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  Var instance;
  Var thisInstance;
  OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  instance = GetReg<unsigned_short>(this,playout->Instance);
  thisInstance = GetReg<unsigned_short>(this,playout->Value2);
  ProfiledSetSuperProperty<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned,false>
            (this,playout,instance,thisInstance,PropertyOperation_StrictMode);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ProfiledSetSuperPropertyStrict(unaligned T* playout)
    {
        ProfiledSetSuperProperty<T, false>(playout, GetReg(playout->Instance), GetReg(playout->Value2), PropertyOperation_StrictMode);
    }